

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_sse4.c
# Opt level: O3

void load_buffer_16x16(int16_t *input,__m128i *out,int stride,int flipud,int fliplr,int shift)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined4 uVar7;
  undefined8 uVar8;
  undefined4 uVar9;
  int iVar10;
  undefined1 (*pauVar11) [16];
  long lVar12;
  undefined1 (*pauVar13) [16];
  int iVar14;
  undefined1 (*pauVar15) [16];
  int iVar16;
  undefined1 (*pauVar17) [16];
  int iVar18;
  undefined1 (*pauVar19) [16];
  int iVar20;
  undefined1 (*pauVar21) [16];
  int iVar22;
  undefined1 (*pauVar23) [16];
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [16];
  undefined1 (*pauVar26) [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 (*local_458) [16];
  undefined1 (*local_448) [16];
  undefined1 local_438 [16];
  undefined1 local_428 [16];
  undefined1 local_418 [16];
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  int local_3e8;
  undefined4 uStack_3e4;
  undefined4 uStack_3e0;
  undefined4 uStack_3dc;
  int local_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  int local_398;
  undefined4 uStack_394;
  undefined4 uStack_390;
  undefined4 uStack_38c;
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  int local_368;
  undefined4 uStack_364;
  undefined4 uStack_360;
  undefined4 uStack_35c;
  int local_358;
  undefined4 uStack_354;
  undefined4 uStack_350;
  undefined4 uStack_34c;
  int local_348;
  undefined4 uStack_344;
  undefined4 uStack_340;
  undefined4 uStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  int local_318;
  undefined4 uStack_314;
  undefined8 uStack_310;
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  int local_2e8;
  undefined4 uStack_2e4;
  undefined8 uStack_2e0;
  int local_2d8;
  undefined4 uStack_2d4;
  undefined8 uStack_2d0;
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  int local_298;
  undefined4 uStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  int local_268;
  undefined4 uStack_264;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  int local_258;
  undefined4 uStack_254;
  undefined4 uStack_250;
  undefined4 uStack_24c;
  int local_248;
  undefined4 uStack_244;
  undefined4 uStack_240;
  undefined4 uStack_23c;
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [16];
  int local_1e8;
  undefined4 uStack_1e4;
  undefined8 uStack_1e0;
  int local_1d8;
  undefined4 uStack_1d4;
  undefined8 uStack_1d0;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  int local_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  int local_168;
  undefined4 uStack_164;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  int local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  int local_148;
  undefined4 uStack_144;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  int local_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  int local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  pauVar21 = (undefined1 (*) [16])(input + 8);
  local_448 = (undefined1 (*) [16])(input + stride * 8);
  local_458 = (undefined1 (*) [16])(input + (long)(stride * 8) + 8);
  if (flipud == 0) {
    if (fliplr == 0) {
      pauVar25 = (undefined1 (*) [16])(input + stride);
      pauVar26 = (undefined1 (*) [16])(input + stride * 2);
      pauVar23 = (undefined1 (*) [16])(input + stride * 3);
      pauVar24 = (undefined1 (*) [16])(input + stride * 4);
      pauVar17 = (undefined1 (*) [16])(input + stride * 5);
      pauVar11 = (undefined1 (*) [16])(input + stride * 6);
      pauVar13 = (undefined1 (*) [16])(input + stride * 7);
      pauVar15 = (undefined1 (*) [16])input;
      pauVar19 = pauVar21;
      input = (int16_t *)local_448;
      goto LAB_0041de0e;
    }
    pauVar25 = (undefined1 (*) [16])(*pauVar21 + (long)stride * 2);
    pauVar26 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 2) * 2);
    pauVar23 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 3) * 2);
    pauVar24 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 4) * 2);
    pauVar17 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 5) * 2);
    pauVar11 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 6) * 2);
    pauVar13 = (undefined1 (*) [16])(*pauVar21 + (long)(stride * 7) * 2);
    pauVar15 = pauVar21;
    pauVar19 = (undefined1 (*) [16])input;
  }
  else {
    if (fliplr == 0) {
      pauVar25 = (undefined1 (*) [16])(*local_448 + (long)(stride * 6) * 2);
      pauVar26 = (undefined1 (*) [16])(*local_448 + (long)(stride * 5) * 2);
      pauVar23 = (undefined1 (*) [16])(*local_448 + (long)(stride * 4) * 2);
      pauVar24 = (undefined1 (*) [16])(*local_448 + (long)(stride * 3) * 2);
      pauVar17 = (undefined1 (*) [16])(*local_448 + (long)(stride * 2) * 2);
      pauVar11 = (undefined1 (*) [16])(*local_448 + (long)stride * 2);
      pauVar15 = (undefined1 (*) [16])(*local_448 + (long)(stride * 7) * 2);
      pauVar19 = local_458;
      pauVar13 = local_448;
      local_458 = pauVar21;
LAB_0041de0e:
      auVar70 = *pauVar24;
      auVar75 = *pauVar17;
      auVar64 = *pauVar11;
      auVar72 = *pauVar23;
      auVar61 = *pauVar26;
      auVar68 = *pauVar25;
      auVar77 = *pauVar15;
      auVar59 = *pauVar13;
      auVar73 = pmovsxwd(in_XMM9,auVar77);
      local_438._0_4_ = auVar73._0_4_ << shift;
      local_438._4_4_ = auVar73._4_4_;
      local_438._8_4_ = auVar73._8_4_;
      local_438._12_4_ = auVar73._12_4_;
      auVar69._8_4_ = auVar77._8_4_;
      auVar69._12_4_ = auVar77._12_4_;
      auVar69._0_8_ = auVar77._8_8_;
      auVar77 = pmovsxwd(auVar69,auVar69);
      local_428._0_4_ = auVar77._0_4_ << shift;
      local_428._4_4_ = auVar77._4_4_;
      local_428._8_4_ = auVar77._8_4_;
      local_428._12_4_ = auVar77._12_4_;
      auVar77 = pmovsxwd(local_428,auVar68);
      local_418._4_4_ = auVar77._4_4_;
      local_418._0_4_ = auVar77._0_4_ << shift;
      local_418._8_4_ = auVar77._8_4_;
      local_418._12_4_ = auVar77._12_4_;
      auVar73._8_4_ = auVar68._8_4_;
      auVar73._12_4_ = auVar68._12_4_;
      auVar73._0_8_ = auVar68._8_8_;
      auVar68 = pmovsxwd(auVar73,auVar73);
      local_408._0_4_ = auVar68._0_4_ << shift;
      local_408._4_4_ = auVar68._4_4_;
      local_408._8_4_ = auVar68._8_4_;
      local_408._12_4_ = auVar68._12_4_;
      auVar68 = pmovsxwd(local_408,auVar61);
      local_3f8._0_4_ = auVar68._0_4_ << shift;
      local_3f8._4_4_ = auVar68._4_4_;
      local_3f8._8_4_ = auVar68._8_4_;
      local_3f8._12_4_ = auVar68._12_4_;
      auVar68 = pmovsxwd(local_3f8,auVar72);
      auVar77._8_4_ = auVar61._8_4_;
      auVar77._12_4_ = auVar61._12_4_;
      auVar77._0_8_ = auVar61._8_8_;
      auVar61 = pmovsxwd(auVar77,auVar77);
      local_3e8 = auVar61._0_4_ << shift;
      uStack_3e4 = auVar61._4_4_;
      uStack_3e0 = auVar61._8_4_;
      uStack_3dc = auVar61._12_4_;
      local_3d8 = auVar68._0_4_ << shift;
      uStack_3d4 = auVar68._4_4_;
      uStack_3d0 = auVar68._8_4_;
      uStack_3cc = auVar68._12_4_;
      auVar68._8_4_ = auVar72._8_4_;
      auVar68._12_4_ = auVar72._12_4_;
      auVar68._0_8_ = auVar72._8_8_;
      auVar72 = pmovsxwd(auVar68,auVar68);
      local_3c8._0_4_ = auVar72._0_4_ << shift;
      local_3c8._4_4_ = auVar72._4_4_;
      local_3c8._8_4_ = auVar72._8_4_;
      local_3c8._12_4_ = auVar72._12_4_;
      auVar72 = pmovsxwd(local_3c8,auVar70);
      local_3b8._4_4_ = auVar72._4_4_;
      local_3b8._0_4_ = auVar72._0_4_ << shift;
      local_3b8._8_4_ = auVar72._8_4_;
      local_3b8._12_4_ = auVar72._12_4_;
      auVar61._8_4_ = auVar70._8_4_;
      auVar61._12_4_ = auVar70._12_4_;
      auVar61._0_8_ = auVar70._8_8_;
      auVar70 = pmovsxwd(auVar61,auVar61);
      local_3a8._0_4_ = auVar70._0_4_ << shift;
      local_3a8._4_4_ = auVar70._4_4_;
      local_3a8._8_4_ = auVar70._8_4_;
      local_3a8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_3a8,auVar75);
      local_398 = auVar70._0_4_ << shift;
      uStack_394 = auVar70._4_4_;
      uStack_390 = auVar70._8_4_;
      uStack_38c = auVar70._12_4_;
      auVar72._8_4_ = auVar75._8_4_;
      auVar72._12_4_ = auVar75._12_4_;
      auVar72._0_8_ = auVar75._8_8_;
      auVar70 = pmovsxwd(auVar72,auVar72);
      local_388._0_4_ = auVar70._0_4_ << shift;
      local_388._4_4_ = auVar70._4_4_;
      local_388._8_4_ = auVar70._8_4_;
      local_388._12_4_ = auVar70._12_4_;
      auVar72 = pmovsxwd(local_388,auVar64);
      auVar75._8_4_ = auVar64._8_4_;
      auVar75._12_4_ = auVar64._12_4_;
      auVar75._0_8_ = auVar64._8_8_;
      auVar70 = pmovsxwd(auVar75,auVar75);
      local_378._0_4_ = auVar72._0_4_ << shift;
      local_378._4_4_ = auVar72._4_4_;
      local_378._8_4_ = auVar72._8_4_;
      local_378._12_4_ = auVar72._12_4_;
      auVar75 = pmovsxwd(local_378,auVar59);
      local_368 = auVar70._0_4_ << shift;
      uStack_364 = auVar70._4_4_;
      uStack_360 = auVar70._8_4_;
      uStack_35c = auVar70._12_4_;
      local_358 = auVar75._0_4_ << shift;
      uStack_354 = auVar75._4_4_;
      uStack_350 = auVar75._8_4_;
      uStack_34c = auVar75._12_4_;
      auVar70._8_4_ = auVar59._8_4_;
      auVar70._12_4_ = auVar59._12_4_;
      auVar70._0_8_ = auVar59._8_8_;
      auVar70 = pmovsxwd(auVar70,auVar70);
      local_348 = auVar70._0_4_ << shift;
      uStack_344 = auVar70._4_4_;
      uStack_340 = auVar70._8_4_;
      uStack_33c = auVar70._12_4_;
      if (flipud == 0) {
        auVar70 = *(undefined1 (*) [16])input;
        iVar18 = stride * 2;
        iVar22 = stride * 3;
        iVar10 = stride * 4;
        iVar14 = stride * 5;
        iVar20 = stride * 6;
        pauVar21 = (undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
        iVar16 = stride;
      }
      else {
        auVar70 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)(stride * 7) * 2);
        iVar14 = stride * 2;
        iVar18 = stride * 5;
        iVar22 = stride * 4;
        iVar10 = stride * 3;
        pauVar21 = (undefined1 (*) [16])input;
        iVar20 = stride;
        iVar16 = stride * 6;
      }
      auVar75 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar20 * 2);
      auVar64 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar14 * 2);
      auVar72 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar10 * 2);
      auVar61 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar22 * 2);
      auVar68 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar18 * 2);
      auVar77 = *(undefined1 (*) [16])(*(undefined1 (*) [16])input + (long)iVar16 * 2);
      auVar59 = *pauVar21;
      auVar73 = pmovsxwd(local_438,auVar70);
      local_238._0_4_ = auVar73._0_4_ << shift;
      local_238._4_4_ = auVar73._4_4_;
      local_238._8_4_ = auVar73._8_4_;
      local_238._12_4_ = auVar73._12_4_;
      auVar27._8_4_ = auVar70._8_4_;
      auVar27._12_4_ = auVar70._12_4_;
      auVar27._0_8_ = auVar70._8_8_;
      auVar70 = pmovsxwd(auVar27,auVar27);
      local_228._0_4_ = auVar70._0_4_ << shift;
      local_228._4_4_ = auVar70._4_4_;
      local_228._8_4_ = auVar70._8_4_;
      local_228._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_228,auVar77);
      local_218._8_8_ = auVar68._8_8_;
      uVar6 = local_218._8_8_;
      local_218._4_4_ = auVar70._4_4_;
      local_218._0_4_ = auVar70._0_4_ << shift;
      local_218._12_4_ = auVar68._12_4_;
      uVar7 = local_218._12_4_;
      local_218._8_4_ = auVar70._8_4_;
      local_218._12_4_ = auVar70._12_4_;
      auVar28._0_8_ = auVar77._8_8_;
      auVar28._8_4_ = auVar77._8_4_;
      auVar28._12_4_ = auVar77._12_4_;
      auVar70 = pmovsxwd(auVar28,auVar28);
      local_208._0_4_ = auVar70._0_4_ << shift;
      local_208._4_4_ = auVar70._4_4_;
      local_208._8_4_ = auVar70._8_4_;
      local_208._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_208,auVar68);
      local_1f8._0_4_ = auVar70._0_4_ << shift;
      local_1f8._4_4_ = auVar70._4_4_;
      local_1f8._8_4_ = auVar70._8_4_;
      local_1f8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_1f8,auVar61);
      auVar62._8_4_ = auVar68._8_4_;
      auVar62._0_8_ = uVar6;
      auVar62._12_4_ = uVar7;
      auVar68 = pmovsxwd(auVar62,auVar62);
      uStack_1e0 = auVar64._8_8_;
      uVar6 = uStack_1e0;
      uStack_1e4 = auVar68._4_4_;
      local_1e8 = auVar68._0_4_ << shift;
      uStack_1e0._4_4_ = auVar64._12_4_;
      uVar7 = uStack_1e0._4_4_;
      uStack_1e0._0_4_ = auVar68._8_4_;
      uStack_1e0._4_4_ = auVar68._12_4_;
      uStack_1d0 = auVar75._8_8_;
      uVar8 = uStack_1d0;
      uStack_1d4 = auVar70._4_4_;
      local_1d8 = auVar70._0_4_ << shift;
      uStack_1d0._4_4_ = auVar75._12_4_;
      uVar9 = uStack_1d0._4_4_;
      uStack_1d0._0_4_ = auVar70._8_4_;
      uStack_1d0._4_4_ = auVar70._12_4_;
      auVar29._0_8_ = auVar61._8_8_;
      auVar29._8_4_ = auVar61._8_4_;
      auVar29._12_4_ = auVar61._12_4_;
      auVar70 = pmovsxwd(auVar29,auVar29);
      local_1c8._0_4_ = auVar70._0_4_ << shift;
      local_1c8._4_4_ = auVar70._4_4_;
      local_1c8._8_4_ = auVar70._8_4_;
      local_1c8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_1c8,auVar72);
      local_1b8._4_4_ = auVar70._4_4_;
      local_1b8._0_4_ = auVar70._0_4_ << shift;
      local_1b8._8_4_ = auVar70._8_4_;
      local_1b8._12_4_ = auVar70._12_4_;
      auVar30._0_8_ = auVar72._8_8_;
      auVar30._8_4_ = auVar72._8_4_;
      auVar30._12_4_ = auVar72._12_4_;
      auVar70 = pmovsxwd(auVar30,auVar30);
      local_1a8._0_4_ = auVar70._0_4_ << shift;
      local_1a8._4_4_ = auVar70._4_4_;
      local_1a8._8_4_ = auVar70._8_4_;
      local_1a8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_1a8,auVar64);
      local_198 = auVar70._0_4_ << shift;
      uStack_194 = auVar70._4_4_;
      uStack_190 = auVar70._8_4_;
      uStack_18c = auVar70._12_4_;
      auVar64._8_4_ = auVar64._8_4_;
      auVar64._0_8_ = uVar6;
      auVar64._12_4_ = uVar7;
      auVar70 = pmovsxwd(auVar64,auVar64);
      local_188._0_4_ = auVar70._0_4_ << shift;
      local_188._4_4_ = auVar70._4_4_;
      local_188._8_4_ = auVar70._8_4_;
      local_188._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_188,auVar75);
      auVar43._8_4_ = auVar75._8_4_;
      auVar43._0_8_ = uVar8;
      auVar43._12_4_ = uVar9;
      auVar75 = pmovsxwd(auVar43,auVar43);
      local_178._0_4_ = auVar70._0_4_ << shift;
      local_178._4_4_ = auVar70._4_4_;
      local_178._8_4_ = auVar70._8_4_;
      local_178._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_178,auVar59);
      local_168 = auVar75._0_4_ << shift;
      uStack_164 = auVar75._4_4_;
      uStack_160 = auVar75._8_4_;
      uStack_15c = auVar75._12_4_;
      local_158 = auVar70._0_4_ << shift;
      uStack_154 = auVar70._4_4_;
      uStack_150 = auVar70._8_4_;
      uStack_14c = auVar70._12_4_;
      auVar31._0_8_ = auVar59._8_8_;
      auVar31._8_4_ = auVar59._8_4_;
      auVar31._12_4_ = auVar59._12_4_;
      auVar70 = pmovsxwd(auVar31,auVar31);
      local_148 = auVar70._0_4_ << shift;
      uStack_144 = auVar70._4_4_;
      uStack_140 = auVar70._8_4_;
      uStack_13c = auVar70._12_4_;
      if (flipud == 0) {
        auVar70 = *pauVar19;
        iVar18 = stride * 2;
        iVar22 = stride * 3;
        iVar10 = stride * 4;
        iVar14 = stride * 5;
        iVar20 = stride * 6;
        pauVar21 = (undefined1 (*) [16])(*pauVar19 + (long)(stride * 7) * 2);
        iVar16 = stride;
      }
      else {
        auVar70 = *(undefined1 (*) [16])(*pauVar19 + (long)(stride * 7) * 2);
        iVar14 = stride * 2;
        iVar18 = stride * 5;
        iVar22 = stride * 4;
        iVar10 = stride * 3;
        pauVar21 = pauVar19;
        iVar20 = stride;
        iVar16 = stride * 6;
      }
      auVar75 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar20 * 2);
      auVar64 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar14 * 2);
      auVar72 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar10 * 2);
      auVar61 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar22 * 2);
      auVar68 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar18 * 2);
      auVar77 = *(undefined1 (*) [16])(*pauVar19 + (long)iVar16 * 2);
      auVar59 = *pauVar21;
      auVar73 = pmovsxwd(local_238,auVar70);
      local_338._8_8_ = auVar70._8_8_;
      uVar6 = local_338._8_8_;
      local_338._4_4_ = auVar73._4_4_;
      local_338._0_4_ = auVar73._0_4_ << shift;
      local_338._12_4_ = auVar70._12_4_;
      uVar7 = local_338._12_4_;
      local_338._8_4_ = auVar73._8_4_;
      local_338._12_4_ = auVar73._12_4_;
      auVar32._8_4_ = auVar70._8_4_;
      auVar32._0_8_ = uVar6;
      auVar32._12_4_ = uVar7;
      auVar70 = pmovsxwd(auVar32,auVar32);
      local_328._0_4_ = auVar70._0_4_ << shift;
      local_328._4_4_ = auVar70._4_4_;
      local_328._8_4_ = auVar70._8_4_;
      local_328._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_328,auVar77);
      uStack_310 = auVar68._8_8_;
      uVar6 = uStack_310;
      uStack_314 = auVar70._4_4_;
      local_318 = auVar70._0_4_ << shift;
      uStack_310._4_4_ = auVar68._12_4_;
      uVar7 = uStack_310._4_4_;
      uStack_310._0_4_ = auVar70._8_4_;
      uStack_310._4_4_ = auVar70._12_4_;
      auVar33._0_8_ = auVar77._8_8_;
      auVar33._8_4_ = auVar77._8_4_;
      auVar33._12_4_ = auVar77._12_4_;
      auVar70 = pmovsxwd(auVar33,auVar33);
      local_308._0_4_ = auVar70._0_4_ << shift;
      local_308._4_4_ = auVar70._4_4_;
      local_308._8_4_ = auVar70._8_4_;
      local_308._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_308,auVar68);
      local_2f8._0_4_ = auVar70._0_4_ << shift;
      local_2f8._4_4_ = auVar70._4_4_;
      local_2f8._8_4_ = auVar70._8_4_;
      local_2f8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_2f8,auVar61);
      auVar63._8_4_ = auVar68._8_4_;
      auVar63._0_8_ = uVar6;
      auVar63._12_4_ = uVar7;
      auVar68 = pmovsxwd(auVar63,auVar63);
      uStack_2e0 = auVar64._8_8_;
      uVar6 = uStack_2e0;
      uStack_2e4 = auVar68._4_4_;
      local_2e8 = auVar68._0_4_ << shift;
      uStack_2e0._4_4_ = auVar64._12_4_;
      uVar7 = uStack_2e0._4_4_;
      uStack_2e0._0_4_ = auVar68._8_4_;
      uStack_2e0._4_4_ = auVar68._12_4_;
      uStack_2d0 = auVar75._8_8_;
      uVar8 = uStack_2d0;
      uStack_2d4 = auVar70._4_4_;
      local_2d8 = auVar70._0_4_ << shift;
      uStack_2d0._4_4_ = auVar75._12_4_;
      uVar9 = uStack_2d0._4_4_;
      uStack_2d0._0_4_ = auVar70._8_4_;
      uStack_2d0._4_4_ = auVar70._12_4_;
      auVar34._0_8_ = auVar61._8_8_;
      auVar34._8_4_ = auVar61._8_4_;
      auVar34._12_4_ = auVar61._12_4_;
      auVar70 = pmovsxwd(auVar34,auVar34);
      local_2c8._0_4_ = auVar70._0_4_ << shift;
      local_2c8._4_4_ = auVar70._4_4_;
      local_2c8._8_4_ = auVar70._8_4_;
      local_2c8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_2c8,auVar72);
      local_2b8._4_4_ = auVar70._4_4_;
      local_2b8._0_4_ = auVar70._0_4_ << shift;
      local_2b8._8_4_ = auVar70._8_4_;
      local_2b8._12_4_ = auVar70._12_4_;
      auVar35._0_8_ = auVar72._8_8_;
      auVar35._8_4_ = auVar72._8_4_;
      auVar35._12_4_ = auVar72._12_4_;
      auVar70 = pmovsxwd(auVar35,auVar35);
      local_2a8._0_4_ = auVar70._0_4_ << shift;
      local_2a8._4_4_ = auVar70._4_4_;
      local_2a8._8_4_ = auVar70._8_4_;
      local_2a8._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_2a8,auVar64);
      local_298 = auVar70._0_4_ << shift;
      uStack_294 = auVar70._4_4_;
      uStack_290 = auVar70._8_4_;
      uStack_28c = auVar70._12_4_;
      auVar36._8_4_ = auVar64._8_4_;
      auVar36._0_8_ = uVar6;
      auVar36._12_4_ = uVar7;
      auVar70 = pmovsxwd(auVar36,auVar36);
      local_288._0_4_ = auVar70._0_4_ << shift;
      local_288._4_4_ = auVar70._4_4_;
      local_288._8_4_ = auVar70._8_4_;
      local_288._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_288,auVar75);
      auVar44._8_4_ = auVar75._8_4_;
      auVar44._0_8_ = uVar8;
      auVar44._12_4_ = uVar9;
      auVar75 = pmovsxwd(auVar44,auVar44);
      local_278._0_4_ = auVar70._0_4_ << shift;
      local_278._4_4_ = auVar70._4_4_;
      local_278._8_4_ = auVar70._8_4_;
      local_278._12_4_ = auVar70._12_4_;
      auVar70 = pmovsxwd(local_278,auVar59);
      local_268 = auVar75._0_4_ << shift;
      uStack_264 = auVar75._4_4_;
      uStack_260 = auVar75._8_4_;
      uStack_25c = auVar75._12_4_;
      local_258 = auVar70._0_4_ << shift;
      uStack_254 = auVar70._4_4_;
      uStack_250 = auVar70._8_4_;
      uStack_24c = auVar70._12_4_;
      auVar37._0_8_ = auVar59._8_8_;
      auVar37._8_4_ = auVar59._8_4_;
      auVar37._12_4_ = auVar59._12_4_;
      auVar70 = pmovsxwd(auVar37,auVar37);
      local_248 = auVar70._0_4_ << shift;
      uStack_244 = auVar70._4_4_;
      uStack_240 = auVar70._8_4_;
      uStack_23c = auVar70._12_4_;
      if (flipud == 0) {
        auVar70 = *local_458;
        iVar18 = stride * 2;
        iVar22 = stride * 3;
        iVar10 = stride * 4;
        iVar14 = stride * 5;
        iVar20 = stride * 6;
        pauVar21 = (undefined1 (*) [16])(*local_458 + (long)(stride * 7) * 2);
      }
      else {
        auVar70 = *(undefined1 (*) [16])(*local_458 + (long)(stride * 7) * 2);
        iVar14 = stride * 2;
        iVar18 = stride * 5;
        iVar22 = stride * 4;
        iVar10 = stride * 3;
        pauVar21 = local_458;
        iVar20 = stride;
        stride = stride * 6;
      }
      auVar75 = *(undefined1 (*) [16])(*local_458 + (long)iVar20 * 2);
      auVar64 = *(undefined1 (*) [16])(*local_458 + (long)iVar14 * 2);
      auVar72 = *(undefined1 (*) [16])(*local_458 + (long)iVar10 * 2);
      auVar61 = *(undefined1 (*) [16])(*local_458 + (long)iVar22 * 2);
      auVar68 = *(undefined1 (*) [16])(*local_458 + (long)iVar18 * 2);
      auVar77 = *(undefined1 (*) [16])(*local_458 + (long)stride * 2);
      auVar59 = *pauVar21;
      goto LAB_0041e497;
    }
    pauVar25 = (undefined1 (*) [16])(*local_458 + (long)(stride * 6) * 2);
    pauVar26 = (undefined1 (*) [16])(*local_458 + (long)(stride * 5) * 2);
    pauVar23 = (undefined1 (*) [16])(*local_458 + (long)(stride * 4) * 2);
    pauVar24 = (undefined1 (*) [16])(*local_458 + (long)(stride * 3) * 2);
    pauVar17 = (undefined1 (*) [16])(*local_458 + (long)(stride * 2) * 2);
    pauVar11 = (undefined1 (*) [16])(*local_458 + (long)stride * 2);
    pauVar13 = local_458;
    pauVar15 = (undefined1 (*) [16])(*local_458 + (long)(stride * 7) * 2);
    pauVar19 = local_448;
    local_458 = pauVar21;
    local_448 = (undefined1 (*) [16])input;
  }
  auVar64 = pshufb(*pauVar25,_DAT_005642a0);
  auVar70 = pshufb(*pauVar15,_DAT_005642a0);
  auVar75 = pmovsxwd(in_XMM10,auVar70);
  local_438._0_4_ = auVar75._0_4_ << shift;
  local_438._4_4_ = auVar75._4_4_;
  local_438._8_4_ = auVar75._8_4_;
  local_438._12_4_ = auVar75._12_4_;
  auVar75 = pmovsxwd(local_438,auVar64);
  auVar71._8_4_ = auVar70._8_4_;
  auVar71._12_4_ = auVar70._12_4_;
  auVar71._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar71,auVar71);
  local_418._0_4_ = auVar75._0_4_ << shift;
  local_418._4_4_ = auVar75._4_4_;
  local_418._8_4_ = auVar75._8_4_;
  local_418._12_4_ = auVar75._12_4_;
  local_428._4_4_ = auVar70._4_4_;
  local_428._0_4_ = auVar70._0_4_ << shift;
  local_428._8_4_ = auVar70._8_4_;
  local_428._12_4_ = auVar70._12_4_;
  auVar75 = pshufb(*pauVar23,_DAT_005642a0);
  auVar70 = pshufb(*pauVar26,_DAT_005642a0);
  auVar65._8_4_ = auVar64._8_4_;
  auVar65._12_4_ = auVar64._12_4_;
  auVar65._0_8_ = auVar64._8_8_;
  auVar64 = pmovsxwd(auVar65,auVar65);
  local_408._0_4_ = auVar64._0_4_ << shift;
  local_408._4_4_ = auVar64._4_4_;
  local_408._8_4_ = auVar64._8_4_;
  local_408._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_408,auVar70);
  local_3f8._0_4_ = auVar64._0_4_ << shift;
  local_3f8._4_4_ = auVar64._4_4_;
  local_3f8._8_4_ = auVar64._8_4_;
  local_3f8._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_3f8,auVar75);
  auVar60._8_4_ = auVar70._8_4_;
  auVar60._12_4_ = auVar70._12_4_;
  auVar60._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar60,auVar60);
  local_3e8 = auVar70._0_4_ << shift;
  uStack_3e4 = auVar70._4_4_;
  uStack_3e0 = auVar70._8_4_;
  uStack_3dc = auVar70._12_4_;
  local_3d8 = auVar64._0_4_ << shift;
  uStack_3d4 = auVar64._4_4_;
  uStack_3d0 = auVar64._8_4_;
  uStack_3cc = auVar64._12_4_;
  auVar70 = pshufb(*pauVar24,_DAT_005642a0);
  auVar56._8_4_ = auVar75._8_4_;
  auVar56._12_4_ = auVar75._12_4_;
  auVar56._0_8_ = auVar75._8_8_;
  auVar75 = pmovsxwd(auVar56,auVar56);
  local_3c8._0_4_ = auVar75._0_4_ << shift;
  local_3c8._4_4_ = auVar75._4_4_;
  local_3c8._8_4_ = auVar75._8_4_;
  local_3c8._12_4_ = auVar75._12_4_;
  auVar64 = pmovsxwd(local_3c8,auVar70);
  auVar55._8_4_ = auVar70._8_4_;
  auVar55._12_4_ = auVar70._12_4_;
  auVar55._0_8_ = auVar70._8_8_;
  auVar75 = pmovsxwd(auVar55,auVar55);
  auVar70 = pshufb(*pauVar17,_DAT_005642a0);
  local_3b8._0_4_ = auVar64._0_4_ << shift;
  local_3b8._4_4_ = auVar64._4_4_;
  local_3b8._8_4_ = auVar64._8_4_;
  local_3b8._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_3b8,auVar70);
  local_3a8._4_4_ = auVar75._4_4_;
  local_3a8._0_4_ = auVar75._0_4_ << shift;
  local_3a8._8_4_ = auVar75._8_4_;
  local_3a8._12_4_ = auVar75._12_4_;
  local_398 = auVar64._0_4_ << shift;
  uStack_394 = auVar64._4_4_;
  uStack_390 = auVar64._8_4_;
  uStack_38c = auVar64._12_4_;
  auVar46._8_4_ = auVar70._8_4_;
  auVar46._12_4_ = auVar70._12_4_;
  auVar46._0_8_ = auVar70._8_8_;
  auVar75 = pmovsxwd(auVar46,auVar46);
  auVar70 = pshufb(*pauVar11,_DAT_005642a0);
  local_388._0_4_ = auVar75._0_4_ << shift;
  local_388._4_4_ = auVar75._4_4_;
  local_388._8_4_ = auVar75._8_4_;
  local_388._12_4_ = auVar75._12_4_;
  auVar64 = pmovsxwd(local_388,auVar70);
  auVar45._8_4_ = auVar70._8_4_;
  auVar45._12_4_ = auVar70._12_4_;
  auVar45._0_8_ = auVar70._8_8_;
  auVar75 = pmovsxwd(auVar45,auVar45);
  auVar70 = pshufb(*pauVar13,_DAT_005642a0);
  local_378._0_4_ = auVar64._0_4_ << shift;
  local_378._4_4_ = auVar64._4_4_;
  local_378._8_4_ = auVar64._8_4_;
  local_378._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_378,auVar70);
  local_368 = auVar75._0_4_ << shift;
  uStack_364 = auVar75._4_4_;
  uStack_360 = auVar75._8_4_;
  uStack_35c = auVar75._12_4_;
  local_358 = auVar64._0_4_ << shift;
  uStack_354 = auVar64._4_4_;
  uStack_350 = auVar64._8_4_;
  uStack_34c = auVar64._12_4_;
  auVar59._8_4_ = auVar70._8_4_;
  auVar59._12_4_ = auVar70._12_4_;
  auVar59._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar59,auVar59);
  local_348 = auVar70._0_4_ << shift;
  uStack_344 = auVar70._4_4_;
  uStack_340 = auVar70._8_4_;
  uStack_33c = auVar70._12_4_;
  if (flipud == 0) {
    auVar70 = *local_458;
    iVar18 = stride * 2;
    iVar22 = stride * 3;
    iVar10 = stride * 4;
    iVar14 = stride * 5;
    iVar20 = stride * 6;
    pauVar21 = (undefined1 (*) [16])(*local_458 + (long)(stride * 7) * 2);
    iVar16 = stride;
  }
  else {
    auVar70 = *(undefined1 (*) [16])(*local_458 + (long)(stride * 7) * 2);
    iVar14 = stride * 2;
    iVar18 = stride * 5;
    iVar22 = stride * 4;
    iVar10 = stride * 3;
    pauVar21 = local_458;
    iVar20 = stride;
    iVar16 = stride * 6;
  }
  auVar72 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar16 * 2),_DAT_005642a0);
  auVar70 = pshufb(auVar70,_DAT_005642a0);
  auVar75 = pmovsxwd(local_418,auVar70);
  local_238._0_4_ = auVar75._0_4_ << shift;
  local_238._4_4_ = auVar75._4_4_;
  local_238._8_4_ = auVar75._8_4_;
  local_238._12_4_ = auVar75._12_4_;
  auVar75 = pmovsxwd(local_238,auVar72);
  auVar47._8_4_ = auVar70._8_4_;
  auVar47._12_4_ = auVar70._12_4_;
  auVar47._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar47,auVar47);
  local_218._0_4_ = auVar75._0_4_ << shift;
  local_218._4_4_ = auVar75._4_4_;
  local_218._8_4_ = auVar75._8_4_;
  local_218._12_4_ = auVar75._12_4_;
  local_228._4_4_ = auVar70._4_4_;
  local_228._0_4_ = auVar70._0_4_ << shift;
  local_228._8_4_ = auVar70._8_4_;
  local_228._12_4_ = auVar70._12_4_;
  auVar64 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar22 * 2),_DAT_005642a0);
  auVar75 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar18 * 2),_DAT_005642a0);
  auVar48._0_8_ = auVar72._8_8_;
  auVar48._8_4_ = auVar72._8_4_;
  auVar48._12_4_ = auVar72._12_4_;
  auVar70 = pmovsxwd(auVar48,auVar48);
  local_208._0_4_ = auVar70._0_4_ << shift;
  local_208._4_4_ = auVar70._4_4_;
  local_208._8_4_ = auVar70._8_4_;
  local_208._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_208,auVar75);
  local_1f8._0_4_ = auVar70._0_4_ << shift;
  local_1f8._4_4_ = auVar70._4_4_;
  local_1f8._8_4_ = auVar70._8_4_;
  local_1f8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_1f8,auVar64);
  auVar66._8_4_ = auVar75._8_4_;
  auVar66._12_4_ = auVar75._12_4_;
  auVar66._0_8_ = auVar75._8_8_;
  auVar75 = pmovsxwd(auVar66,auVar66);
  uStack_1e4 = auVar75._4_4_;
  local_1e8 = auVar75._0_4_ << shift;
  uStack_1e0._0_4_ = auVar75._8_4_;
  uStack_1e0._4_4_ = auVar75._12_4_;
  uStack_1d4 = auVar70._4_4_;
  local_1d8 = auVar70._0_4_ << shift;
  uStack_1d0._0_4_ = auVar70._8_4_;
  uStack_1d0._4_4_ = auVar70._12_4_;
  auVar75 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar10 * 2),_DAT_005642a0);
  auVar49._0_8_ = auVar64._8_8_;
  auVar49._8_4_ = auVar64._8_4_;
  auVar49._12_4_ = auVar64._12_4_;
  auVar70 = pmovsxwd(auVar49,auVar49);
  local_1c8._0_4_ = auVar70._0_4_ << shift;
  local_1c8._4_4_ = auVar70._4_4_;
  local_1c8._8_4_ = auVar70._8_4_;
  local_1c8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_1c8,auVar75);
  auVar57._8_4_ = auVar75._8_4_;
  auVar57._12_4_ = auVar75._12_4_;
  auVar57._0_8_ = auVar75._8_8_;
  auVar64 = pmovsxwd(auVar57,auVar57);
  auVar75 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar14 * 2),_DAT_005642a0);
  local_1b8._0_4_ = auVar70._0_4_ << shift;
  local_1b8._4_4_ = auVar70._4_4_;
  local_1b8._8_4_ = auVar70._8_4_;
  local_1b8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_1b8,auVar75);
  local_1a8._4_4_ = auVar64._4_4_;
  local_1a8._0_4_ = auVar64._0_4_ << shift;
  local_1a8._8_4_ = auVar64._8_4_;
  local_1a8._12_4_ = auVar64._12_4_;
  local_198 = auVar70._0_4_ << shift;
  uStack_194 = auVar70._4_4_;
  uStack_190 = auVar70._8_4_;
  uStack_18c = auVar70._12_4_;
  auVar50._0_8_ = auVar75._8_8_;
  auVar50._8_4_ = auVar75._8_4_;
  auVar50._12_4_ = auVar75._12_4_;
  auVar75 = pmovsxwd(auVar50,auVar50);
  auVar70 = pshufb(*(undefined1 (*) [16])(*local_458 + (long)iVar20 * 2),_DAT_005642a0);
  local_188._0_4_ = auVar75._0_4_ << shift;
  local_188._4_4_ = auVar75._4_4_;
  local_188._8_4_ = auVar75._8_4_;
  local_188._12_4_ = auVar75._12_4_;
  auVar64 = pmovsxwd(local_188,auVar70);
  auVar39._8_4_ = auVar70._8_4_;
  auVar39._12_4_ = auVar70._12_4_;
  auVar39._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar39,auVar39);
  auVar75 = pshufb(*pauVar21,_DAT_005642a0);
  local_178._0_4_ = auVar64._0_4_ << shift;
  local_178._4_4_ = auVar64._4_4_;
  local_178._8_4_ = auVar64._8_4_;
  local_178._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_178,auVar75);
  local_168 = auVar70._0_4_ << shift;
  uStack_164 = auVar70._4_4_;
  uStack_160 = auVar70._8_4_;
  uStack_15c = auVar70._12_4_;
  local_158 = auVar64._0_4_ << shift;
  uStack_154 = auVar64._4_4_;
  uStack_150 = auVar64._8_4_;
  uStack_14c = auVar64._12_4_;
  auVar40._0_8_ = auVar75._8_8_;
  auVar40._8_4_ = auVar75._8_4_;
  auVar40._12_4_ = auVar75._12_4_;
  auVar70 = pmovsxwd(auVar40,auVar40);
  local_148 = auVar70._0_4_ << shift;
  uStack_144 = auVar70._4_4_;
  uStack_140 = auVar70._8_4_;
  uStack_13c = auVar70._12_4_;
  if (flipud == 0) {
    auVar70 = *pauVar19;
    iVar18 = stride * 2;
    iVar22 = stride * 3;
    iVar10 = stride * 4;
    iVar14 = stride * 5;
    iVar20 = stride * 6;
    pauVar21 = (undefined1 (*) [16])(*pauVar19 + (long)(stride * 7) * 2);
    iVar16 = stride;
  }
  else {
    auVar70 = *(undefined1 (*) [16])(*pauVar19 + (long)(stride * 7) * 2);
    iVar14 = stride * 2;
    iVar18 = stride * 5;
    iVar22 = stride * 4;
    iVar10 = stride * 3;
    pauVar21 = pauVar19;
    iVar20 = stride;
    iVar16 = stride * 6;
  }
  auVar72 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar16 * 2),_DAT_005642a0);
  auVar70 = pshufb(auVar70,_DAT_005642a0);
  auVar75 = pmovsxwd(local_218,auVar70);
  local_338._0_4_ = auVar75._0_4_ << shift;
  local_338._4_4_ = auVar75._4_4_;
  local_338._8_4_ = auVar75._8_4_;
  local_338._12_4_ = auVar75._12_4_;
  auVar75 = pmovsxwd(local_338,auVar72);
  auVar51._8_4_ = auVar70._8_4_;
  auVar51._12_4_ = auVar70._12_4_;
  auVar51._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar51,auVar51);
  local_328._4_4_ = auVar70._4_4_;
  local_328._0_4_ = auVar70._0_4_ << shift;
  local_328._8_4_ = auVar70._8_4_;
  local_328._12_4_ = auVar70._12_4_;
  uStack_314 = auVar75._4_4_;
  local_318 = auVar75._0_4_ << shift;
  uStack_310._0_4_ = auVar75._8_4_;
  uStack_310._4_4_ = auVar75._12_4_;
  auVar64 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar22 * 2),_DAT_005642a0);
  auVar75 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar18 * 2),_DAT_005642a0);
  auVar52._0_8_ = auVar72._8_8_;
  auVar52._8_4_ = auVar72._8_4_;
  auVar52._12_4_ = auVar72._12_4_;
  auVar70 = pmovsxwd(auVar52,auVar52);
  local_308._0_4_ = auVar70._0_4_ << shift;
  local_308._4_4_ = auVar70._4_4_;
  local_308._8_4_ = auVar70._8_4_;
  local_308._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_308,auVar75);
  local_2f8._0_4_ = auVar70._0_4_ << shift;
  local_2f8._4_4_ = auVar70._4_4_;
  local_2f8._8_4_ = auVar70._8_4_;
  local_2f8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_2f8,auVar64);
  auVar67._8_4_ = auVar75._8_4_;
  auVar67._12_4_ = auVar75._12_4_;
  auVar67._0_8_ = auVar75._8_8_;
  auVar75 = pmovsxwd(auVar67,auVar67);
  uStack_2e4 = auVar75._4_4_;
  local_2e8 = auVar75._0_4_ << shift;
  uStack_2e0._0_4_ = auVar75._8_4_;
  uStack_2e0._4_4_ = auVar75._12_4_;
  uStack_2d4 = auVar70._4_4_;
  local_2d8 = auVar70._0_4_ << shift;
  uStack_2d0._0_4_ = auVar70._8_4_;
  uStack_2d0._4_4_ = auVar70._12_4_;
  auVar75 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar10 * 2),_DAT_005642a0);
  auVar53._0_8_ = auVar64._8_8_;
  auVar53._8_4_ = auVar64._8_4_;
  auVar53._12_4_ = auVar64._12_4_;
  auVar70 = pmovsxwd(auVar53,auVar53);
  local_2c8._0_4_ = auVar70._0_4_ << shift;
  local_2c8._4_4_ = auVar70._4_4_;
  local_2c8._8_4_ = auVar70._8_4_;
  local_2c8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_2c8,auVar75);
  auVar58._8_4_ = auVar75._8_4_;
  auVar58._12_4_ = auVar75._12_4_;
  auVar58._0_8_ = auVar75._8_8_;
  auVar64 = pmovsxwd(auVar58,auVar58);
  auVar75 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar14 * 2),_DAT_005642a0);
  local_2b8._0_4_ = auVar70._0_4_ << shift;
  local_2b8._4_4_ = auVar70._4_4_;
  local_2b8._8_4_ = auVar70._8_4_;
  local_2b8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_2b8,auVar75);
  local_2a8._4_4_ = auVar64._4_4_;
  local_2a8._0_4_ = auVar64._0_4_ << shift;
  local_2a8._8_4_ = auVar64._8_4_;
  local_2a8._12_4_ = auVar64._12_4_;
  local_298 = auVar70._0_4_ << shift;
  uStack_294 = auVar70._4_4_;
  uStack_290 = auVar70._8_4_;
  uStack_28c = auVar70._12_4_;
  auVar54._0_8_ = auVar75._8_8_;
  auVar54._8_4_ = auVar75._8_4_;
  auVar54._12_4_ = auVar75._12_4_;
  auVar75 = pmovsxwd(auVar54,auVar54);
  auVar70 = pshufb(*(undefined1 (*) [16])(*pauVar19 + (long)iVar20 * 2),_DAT_005642a0);
  local_288._0_4_ = auVar75._0_4_ << shift;
  local_288._4_4_ = auVar75._4_4_;
  local_288._8_4_ = auVar75._8_4_;
  local_288._12_4_ = auVar75._12_4_;
  auVar64 = pmovsxwd(local_288,auVar70);
  auVar41._8_4_ = auVar70._8_4_;
  auVar41._12_4_ = auVar70._12_4_;
  auVar41._0_8_ = auVar70._8_8_;
  auVar70 = pmovsxwd(auVar41,auVar41);
  auVar75 = pshufb(*pauVar21,_DAT_005642a0);
  local_278._0_4_ = auVar64._0_4_ << shift;
  local_278._4_4_ = auVar64._4_4_;
  local_278._8_4_ = auVar64._8_4_;
  local_278._12_4_ = auVar64._12_4_;
  auVar64 = pmovsxwd(local_278,auVar75);
  local_268 = auVar70._0_4_ << shift;
  uStack_264 = auVar70._4_4_;
  uStack_260 = auVar70._8_4_;
  uStack_25c = auVar70._12_4_;
  local_258 = auVar64._0_4_ << shift;
  uStack_254 = auVar64._4_4_;
  uStack_250 = auVar64._8_4_;
  uStack_24c = auVar64._12_4_;
  auVar42._0_8_ = auVar75._8_8_;
  auVar42._8_4_ = auVar75._8_4_;
  auVar42._12_4_ = auVar75._12_4_;
  auVar70 = pmovsxwd(auVar42,auVar42);
  local_248 = auVar70._0_4_ << shift;
  uStack_244 = auVar70._4_4_;
  uStack_240 = auVar70._8_4_;
  uStack_23c = auVar70._12_4_;
  if (flipud == 0) {
    auVar70 = *local_448;
    iVar18 = stride * 2;
    iVar22 = stride * 3;
    iVar10 = stride * 4;
    iVar14 = stride * 5;
    iVar20 = stride * 6;
    pauVar21 = (undefined1 (*) [16])(*local_448 + (long)(stride * 7) * 2);
  }
  else {
    auVar70 = *(undefined1 (*) [16])(*local_448 + (long)(stride * 7) * 2);
    iVar14 = stride * 2;
    iVar18 = stride * 5;
    iVar22 = stride * 4;
    iVar10 = stride * 3;
    pauVar21 = local_448;
    iVar20 = stride;
    stride = stride * 6;
  }
  auVar70 = pshufb(auVar70,_DAT_005642a0);
  auVar77 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)stride * 2),_DAT_005642a0);
  auVar68 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)iVar18 * 2),_DAT_005642a0);
  auVar61 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)iVar22 * 2),_DAT_005642a0);
  auVar72 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)iVar10 * 2),_DAT_005642a0);
  auVar64 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)iVar14 * 2),_DAT_005642a0);
  auVar75 = pshufb(*(undefined1 (*) [16])(*local_448 + (long)iVar20 * 2),_DAT_005642a0);
  auVar59 = pshufb(*pauVar21,_DAT_005642a0);
LAB_0041e497:
  auVar76._0_8_ = auVar64._8_8_;
  auVar76._8_4_ = auVar64._8_4_;
  auVar76._12_4_ = auVar64._12_4_;
  auVar74._0_8_ = auVar75._8_8_;
  auVar74._8_4_ = auVar75._8_4_;
  auVar74._12_4_ = auVar75._12_4_;
  auVar38._0_8_ = auVar70._8_8_;
  auVar38._8_4_ = auVar70._8_4_;
  auVar38._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(auVar70,auVar70);
  uStack_134 = auVar70._4_4_;
  local_138 = auVar70._0_4_ << shift;
  uStack_130 = auVar70._8_4_;
  uStack_12c = auVar70._12_4_;
  auVar70 = pmovsxwd(auVar38,auVar38);
  local_128._0_4_ = auVar70._0_4_ << shift;
  local_128._4_4_ = auVar70._4_4_;
  local_128._8_4_ = auVar70._8_4_;
  local_128._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_128,auVar77);
  local_118._0_4_ = auVar70._0_4_ << shift;
  local_118._4_4_ = auVar70._4_4_;
  local_118._8_4_ = auVar70._8_4_;
  local_118._12_4_ = auVar70._12_4_;
  auVar5._8_4_ = auVar77._8_4_;
  auVar5._0_8_ = auVar77._8_8_;
  auVar5._12_4_ = auVar77._12_4_;
  auVar70 = pmovsxwd(local_118,auVar5);
  local_108._0_4_ = auVar70._0_4_ << shift;
  local_108._4_4_ = auVar70._4_4_;
  local_108._8_4_ = auVar70._8_4_;
  local_108._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_108,auVar68);
  local_f8._0_4_ = auVar70._0_4_ << shift;
  local_f8._4_4_ = auVar70._4_4_;
  local_f8._8_4_ = auVar70._8_4_;
  local_f8._12_4_ = auVar70._12_4_;
  auVar4._8_4_ = auVar68._8_4_;
  auVar4._0_8_ = auVar68._8_8_;
  auVar4._12_4_ = auVar68._12_4_;
  auVar70 = pmovsxwd(local_f8,auVar4);
  local_e8._0_4_ = auVar70._0_4_ << shift;
  local_e8._4_4_ = auVar70._4_4_;
  local_e8._8_4_ = auVar70._8_4_;
  local_e8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_e8,auVar61);
  local_d8._0_4_ = auVar70._0_4_ << shift;
  local_d8._4_4_ = auVar70._4_4_;
  local_d8._8_4_ = auVar70._8_4_;
  local_d8._12_4_ = auVar70._12_4_;
  auVar3._8_4_ = auVar61._8_4_;
  auVar3._0_8_ = auVar61._8_8_;
  auVar3._12_4_ = auVar61._12_4_;
  auVar70 = pmovsxwd(local_d8,auVar3);
  local_c8._0_4_ = auVar70._0_4_ << shift;
  local_c8._4_4_ = auVar70._4_4_;
  local_c8._8_4_ = auVar70._8_4_;
  local_c8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_c8,auVar72);
  local_b8._0_4_ = auVar70._0_4_ << shift;
  local_b8._4_4_ = auVar70._4_4_;
  local_b8._8_4_ = auVar70._8_4_;
  local_b8._12_4_ = auVar70._12_4_;
  auVar2._8_4_ = auVar72._8_4_;
  auVar2._0_8_ = auVar72._8_8_;
  auVar2._12_4_ = auVar72._12_4_;
  auVar70 = pmovsxwd(local_b8,auVar2);
  local_a8._0_4_ = auVar70._0_4_ << shift;
  local_a8._4_4_ = auVar70._4_4_;
  local_a8._8_4_ = auVar70._8_4_;
  local_a8._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_a8,auVar64);
  local_98._0_4_ = auVar70._0_4_ << shift;
  local_98._4_4_ = auVar70._4_4_;
  local_98._8_4_ = auVar70._8_4_;
  local_98._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_98,auVar76);
  local_88._0_4_ = auVar70._0_4_ << shift;
  local_88._4_4_ = auVar70._4_4_;
  local_88._8_4_ = auVar70._8_4_;
  local_88._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_88,auVar75);
  local_78._0_4_ = auVar70._0_4_ << shift;
  local_78._4_4_ = auVar70._4_4_;
  local_78._8_4_ = auVar70._8_4_;
  local_78._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_78,auVar74);
  local_68._0_4_ = auVar70._0_4_ << shift;
  local_68._4_4_ = auVar70._4_4_;
  local_68._8_4_ = auVar70._8_4_;
  local_68._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_68,auVar59);
  local_58._0_4_ = auVar70._0_4_ << shift;
  local_58._4_4_ = auVar70._4_4_;
  local_58._8_4_ = auVar70._8_4_;
  local_58._12_4_ = auVar70._12_4_;
  auVar70 = pmovsxwd(local_58,auVar59._8_8_);
  local_48 = auVar70._0_4_ << shift;
  uStack_44 = auVar70._4_4_;
  uStack_40 = auVar70._8_4_;
  uStack_3c = auVar70._12_4_;
  lVar12 = 0;
  do {
    uVar6 = *(undefined8 *)(local_438 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)*out + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_438 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_428 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[1] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_428 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_338 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[2] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_338 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_328 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[3] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_328 + lVar12);
    puVar1[1] = uVar6;
    lVar12 = lVar12 + 0x20;
  } while ((int)lVar12 != 0x100);
  lVar12 = 0;
  do {
    uVar6 = *(undefined8 *)(local_238 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[0x20] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_238 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_228 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[0x21] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_228 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_128 + lVar12 + -8);
    puVar1 = (undefined8 *)((long)out[0x22] + lVar12 * 2);
    *puVar1 = *(undefined8 *)((long)&local_138 + lVar12);
    puVar1[1] = uVar6;
    uVar6 = *(undefined8 *)(local_128 + lVar12 + 8);
    puVar1 = (undefined8 *)((long)out[0x23] + lVar12 * 2);
    *puVar1 = *(undefined8 *)(local_128 + lVar12);
    puVar1[1] = uVar6;
    lVar12 = lVar12 + 0x20;
  } while ((int)lVar12 != 0x100);
  return;
}

Assistant:

static inline void load_buffer_16x16(const int16_t *input, __m128i *out,
                                     int stride, int flipud, int fliplr,
                                     int shift) {
  __m128i in[64];
  // Load 4 8x8 blocks
  const int16_t *topL = input;
  const int16_t *topR = input + 8;
  const int16_t *botL = input + 8 * stride;
  const int16_t *botR = input + 8 * stride + 8;

  const int16_t *tmp;

  if (flipud) {
    // Swap left columns
    tmp = topL;
    topL = botL;
    botL = tmp;
    // Swap right columns
    tmp = topR;
    topR = botR;
    botR = tmp;
  }

  if (fliplr) {
    // Swap top rows
    tmp = topL;
    topL = topR;
    topR = tmp;
    // Swap bottom rows
    tmp = botL;
    botL = botR;
    botR = tmp;
  }

  // load first 8 columns
  load_buffer_8x8(topL, &in[0], stride, flipud, fliplr, shift);
  load_buffer_8x8(botL, &in[32], stride, flipud, fliplr, shift);

  // load second 8 columns
  load_buffer_8x8(topR, &in[16], stride, flipud, fliplr, shift);
  load_buffer_8x8(botR, &in[48], stride, flipud, fliplr, shift);

  convert_8x8_to_16x16(in, out);
}